

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O2

int32_t ll_poll_scan_result(llabs_gateway_scan_results_t *scan_result,uint8_t *num_gw)

{
  _Bool _Var1;
  uint uVar2;
  
  if (num_gw == (uint8_t *)0x0 || scan_result == (llabs_gateway_scan_results_t *)0x0) {
    uVar2 = 0xffffff9b;
  }
  else {
    _Var1 = transport_mutex_grab();
    if (_Var1) {
      uVar2 = hal_read_write(OP_GET_SCAN_INFO,(uint8_t *)0x0,0,_ll_ifc_message_buff,0xd1);
      if (-1 < (int)uVar2) {
        ll_gw_scan_result_deserialize(_ll_ifc_message_buff,scan_result,num_gw);
      }
      transport_mutex_release();
      uVar2 = (int)uVar2 >> 0x1f & uVar2;
    }
    else {
      uVar2 = 0xffffff8f;
    }
  }
  return uVar2;
}

Assistant:

int32_t ll_poll_scan_result(llabs_gateway_scan_results_t *scan_result, uint8_t *num_gw)
{
    if (scan_result == NULL || num_gw == NULL)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }
    
    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    uint8_t buff[GW_SCAN_INFO_BUFF_SIZE];

    int32_t ret = hal_read_write(OP_GET_SCAN_INFO, NULL, 0, &_ll_ifc_message_buff[0], GW_SCAN_INFO_BUFF_SIZE);

    if (ret < LL_IFC_ACK)
    {
       goto LL_POLL_SCAN_ERROR;
    }

    ll_gw_scan_result_deserialize(&_ll_ifc_message_buff[0], scan_result, num_gw);
    
LL_POLL_SCAN_ERROR:
    transport_mutex_release();
    return (ret >= 0) ? LL_IFC_ACK : ret;
}